

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_write.cpp
# Opt level: O3

void readvector(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *c,string *filename)

{
  bool bVar1;
  char cVar2;
  istream *piVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  string stra;
  string str;
  ifstream b;
  value_type local_2e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_2c0;
  undefined1 *local_2b8;
  ulong local_2b0;
  undefined1 local_2a8 [16];
  undefined1 *local_298 [2];
  undefined1 local_288 [16];
  char *local_278;
  ulong local_270;
  char local_268 [16];
  char *local_258;
  ulong local_250;
  char local_248 [16];
  long local_238 [65];
  
  local_2b8 = local_2a8;
  local_2b0 = 0;
  local_2a8[0] = 0;
  local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
  local_2e0._M_string_length = 0;
  local_2e0.field_2._M_local_buf[0] = '\0';
  local_2c0 = c;
  std::ifstream::ifstream(local_238);
  std::ifstream::open((string *)local_238,(_Ios_Openmode)filename);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\nfailure to read file",0x15);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
    std::ostream::put('H');
    std::ostream::flush();
  }
  do {
    cVar2 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + (char)(istream *)local_238
                           );
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_238,(string *)&local_2b8,cVar2);
    if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) {
      std::ifstream::close();
      std::ifstream::~ifstream(local_238);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
        operator_delete(local_2e0._M_dataplus._M_p);
      }
      if (local_2b8 != local_2a8) {
        operator_delete(local_2b8);
      }
      return;
    }
    lVar4 = std::__cxx11::string::find((char *)&local_2b8,0x10d08c,0);
    if (lVar4 != -1) {
      std::__cxx11::string::find((char *)&local_2b8,0x10d08c,0);
      std::__cxx11::string::substr((ulong)local_298,(ulong)&local_2b8);
      std::__cxx11::string::operator=((string *)&local_2b8,(string *)local_298);
      if (local_298[0] != local_288) {
        operator_delete(local_298[0]);
      }
    }
    if (local_2b0 != 0) {
      uVar7 = 0;
      do {
        if (local_2b8[uVar7] == ' ') {
          std::__cxx11::string::substr((ulong)local_298,(ulong)&local_2b8);
          std::__cxx11::string::operator=((string *)&local_2e0,(string *)local_298);
          if (local_298[0] != local_288) {
            operator_delete(local_298[0]);
          }
          local_258 = local_248;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_258,local_2e0._M_dataplus._M_p,
                     local_2e0._M_dataplus._M_p + local_2e0._M_string_length);
          if (local_250 == 0) {
            bVar1 = false;
          }
          else {
            bVar1 = true;
            if (*local_258 == ' ') {
              uVar6 = 1;
              do {
                uVar5 = uVar6;
                if (local_250 == uVar5) break;
                uVar6 = uVar5 + 1;
              } while (local_258[uVar5] == ' ');
              bVar1 = uVar5 < local_250;
            }
          }
          if (local_258 != local_248) {
            operator_delete(local_258);
          }
          if (bVar1) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(local_2c0,&local_2e0);
          }
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 < local_2b0);
    }
    std::__cxx11::string::substr((ulong)local_298,(ulong)&local_2b8);
    std::__cxx11::string::operator=((string *)&local_2e0,(string *)local_298);
    if (local_298[0] != local_288) {
      operator_delete(local_298[0]);
    }
    local_278 = local_268;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_278,local_2e0._M_dataplus._M_p,
               local_2e0._M_dataplus._M_p + local_2e0._M_string_length);
    if (local_270 == 0) {
      bVar1 = false;
    }
    else {
      bVar1 = true;
      if (*local_278 == ' ') {
        uVar7 = 1;
        do {
          uVar6 = uVar7;
          if (local_270 == uVar6) break;
          uVar7 = uVar6 + 1;
        } while (local_278[uVar6] == ' ');
        bVar1 = uVar6 < local_270;
      }
    }
    if (local_278 != local_268) {
      operator_delete(local_278);
    }
    if (bVar1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(local_2c0,&local_2e0);
    }
  } while( true );
}

Assistant:

void readvector(vector<string>& c,string filename)
{
	string str,stra;
	int ignore=0;
	int begin = 0;
	int l=0;
	int i = 0;
	int j = 0;
	ifstream b;
	b.open(filename);
	if (!b.is_open()) { cout << "\nfailure to read file" << endl; }
	while (getline(b, str))
	{
			if (str.find("//") != string::npos)
			{
				str = str.substr(0, str.find("//"));
			}
			for (i = 0; i < str.length(); i++)
			{
				l++;
				if (str.at(i) == ' ')
				{
					stra = str.substr(begin, l - 1);
					if (check_string( stra)) {
						c.push_back(stra);
						begin = i + 1;
						l = 0;
					}
					
				}
			}
			stra = str.substr(begin);
			if (check_string(stra))
			{
				c.push_back(stra);
			}
			l = 0;
			begin = 0;


	}
	b.close();

	return;
}